

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgrenderstate.cpp
# Opt level: O2

void __thiscall lunasvg::SVGRenderState::endGroup(SVGRenderState *this,SVGBlendInfo *blendInfo)

{
  Canvas *this_00;
  SVGRenderMode SVar1;
  float opacity;
  
  this_00 = (this->m_canvas).super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 !=
      (this->m_parent->m_canvas).super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr) {
    SVar1 = this->m_mode;
    if (SVar1 == Clipping) {
      opacity = 1.0;
    }
    else {
      opacity = blendInfo->m_opacity;
    }
    if (blendInfo->m_clipper != (SVGClipPathElement *)0x0) {
      SVGClipPathElement::applyClipMask(blendInfo->m_clipper,this);
      SVar1 = this->m_mode;
    }
    if ((SVar1 == Painting) && (blendInfo->m_masker != (SVGMaskElement *)0x0)) {
      SVGMaskElement::applyMask(blendInfo->m_masker,this);
    }
    Canvas::blendCanvas((this->m_parent->m_canvas).
                        super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        (this->m_canvas).
                        super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        Src_Over,opacity);
    return;
  }
  Canvas::restore(this_00);
  return;
}

Assistant:

void SVGRenderState::endGroup(const SVGBlendInfo& blendInfo)
{
    if(m_canvas == m_parent->canvas()) {
        m_canvas->restore();
        return;
    }

    auto opacity = m_mode == SVGRenderMode::Clipping ? 1.f : blendInfo.opacity();
    if(blendInfo.clipper())
        blendInfo.clipper()->applyClipMask(*this);
    if(m_mode == SVGRenderMode::Painting && blendInfo.masker()) {
        blendInfo.masker()->applyMask(*this);
    }

    m_parent->m_canvas->blendCanvas(*m_canvas, BlendMode::Src_Over, opacity);
}